

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::CommandLineInterface::GenerateDependencyManifestFile
          (CommandLineInterface *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files,GeneratorContextMap *output_directories,DiskSourceTree *source_tree)

{
  pointer pbVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  CommandLineInterface *pCVar3;
  bool bVar4;
  int iVar5;
  pointer ppFVar6;
  reference __lhs;
  int *piVar7;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>_>
  *pVVar8;
  ostream *poVar9;
  char *pcVar10;
  ulong uVar11;
  undefined8 *puVar12;
  long lVar13;
  string_view text;
  string_view text_00;
  string_view virtual_file;
  string_view text_01;
  string_view text_02;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  relative_output_filenames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  output_filenames;
  const_iterator __begin2;
  flat_hash_set<const_google::protobuf::FileDescriptor_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  already_seen;
  FileOutputStream out;
  FileDescriptorSet file_set;
  string output_filename;
  undefined1 local_288 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  undefined8 local_258;
  CommandLineInterface *local_248;
  DiskSourceTree *local_240;
  iterator local_238;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  local_228;
  undefined1 local_208 [16];
  _func_int *local_1f8 [7];
  iterator local_1c0;
  undefined1 local_1b0 [72];
  undefined1 local_168 [2];
  bool bStack_166;
  undefined5 uStack_165;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158 [7];
  pointer local_e8;
  pointer local_d8;
  vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
  local_d0;
  vector<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
  local_b8;
  TypeErasedState local_98;
  ManagerType *local_88;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  
  local_248 = this;
  local_240 = source_tree;
  FileDescriptorSet::FileDescriptorSet((FileDescriptorSet *)local_1b0,(Arena *)0x0);
  local_228.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       1;
  local_228.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  ppFVar6 = (parsed_files->
            super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((parsed_files->
      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppFVar6) {
    uVar11 = 0;
    do {
      bStack_166 = false;
      local_168[0] = false;
      local_168[1] = false;
      GetTransitiveDependencies
                (local_248,ppFVar6[uVar11],
                 (flat_hash_set<const_google::protobuf::FileDescriptor_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                  *)&local_228,
                 (RepeatedPtrField<google::protobuf::FileDescriptorProto> *)(local_1b0 + 0x28),
                 (TransitiveDependencyOptions *)local_168);
      uVar11 = uVar11 + 1;
      ppFVar6 = (parsed_files->
                super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar11 < (ulong)((long)(parsed_files->
                                    super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar6 >> 3
                             ));
  }
  local_268._M_allocated_capacity = 0;
  local_268._8_8_ = 0;
  local_258 = 0;
  local_238 = absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
              ::begin((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
                       *)output_directories);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
              *)output_directories);
  local_1c0.ctrl_ = (ctrl_t *)0x0;
  while( true ) {
    pCVar3 = local_248;
    bVar4 = absl::lts_20250127::container_internal::operator==(&local_238,&local_1c0);
    if (bVar4) break;
    __lhs = absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
            ::iterator::operator*(&local_238);
    local_288._0_8_ = (pointer)0x0;
    local_288._8_8_ = (pointer)0x0;
    local_288._16_8_ = (pointer)0x0;
    GeneratorContextImpl::GetOutputFilenames
              ((__lhs->second)._M_t.
               super___uniq_ptr_impl<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>
               .
               super__Head_base<0UL,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_false>
               ._M_head_impl,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_288);
    if (local_288._8_8_ != local_288._0_8_) {
      lVar13 = 0;
      uVar11 = 0;
      do {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_168,&__lhs->first,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_288._0_8_ + lVar13));
        iVar5 = std::__cxx11::string::compare((ulong)local_168,0,(char *)0x2);
        if (iVar5 == 0) {
          std::__cxx11::string::substr((ulong)local_208,(ulong)local_168);
          std::__cxx11::string::operator=((string *)local_168,(string *)local_208);
          if ((_func_int **)local_208._0_8_ != local_1f8) {
            operator_delete((void *)local_208._0_8_,(ulong)(local_1f8[0] + 1));
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_268,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168);
        paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)CONCAT53(uStack_165,CONCAT12(bStack_166,local_168));
        if (paVar2 != local_158) {
          operator_delete(paVar2,local_158[0]._M_allocated_capacity + 1);
        }
        uVar11 = uVar11 + 1;
        lVar13 = lVar13 + 0x20;
      } while (uVar11 < (ulong)((long)(local_288._8_8_ - local_288._0_8_) >> 5));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_288);
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>_>
    ::iterator::operator++(&local_238);
  }
  if ((pCVar3->descriptor_set_out_name_)._M_string_length != 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_268,&pCVar3->descriptor_set_out_name_);
  }
  if ((pCVar3->edition_defaults_out_name_)._M_string_length != 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_268,&pCVar3->edition_defaults_out_name_);
  }
LAB_001d651a:
  iVar5 = open((pCVar3->dependency_out_name_)._M_dataplus._M_p,0x241,0x1b6);
  if (iVar5 < 0) goto code_r0x001d6536;
  bVar4 = true;
  if (local_268._M_allocated_capacity == local_268._8_8_) goto LAB_001d6885;
  io::FileOutputStream::FileOutputStream((FileOutputStream *)local_208,iVar5,-1);
  io::Printer::Printer
            ((Printer *)local_168,(ZeroCopyOutputStream *)local_208,'$',(AnnotationCollector *)0x0);
  if (local_268._8_8_ != local_268._M_allocated_capacity) {
    lVar13 = 8;
    uVar11 = 0;
    do {
      text._M_str = *(char **)(local_268._M_allocated_capacity + lVar13 + -8);
      text._M_len = *(size_t *)(local_268._M_allocated_capacity + lVar13);
      io::Printer::Print<>((Printer *)local_168,text);
      bVar4 = uVar11 != ((long)(local_268._8_8_ - local_268._0_8_) >> 5) - 1U;
      pcVar10 = " \\\n";
      if (!bVar4) {
        pcVar10 = ":";
      }
      text_00._M_str = pcVar10;
      text_00._M_len = (ulong)bVar4 * 2 + 1;
      io::Printer::Print<>((Printer *)local_168,text_00);
      uVar11 = uVar11 + 1;
      lVar13 = lVar13 + 0x20;
    } while (uVar11 < (ulong)((long)(local_268._8_8_ - local_268._0_8_) >> 5));
  }
  if ((int)local_1b0._48_4_ < 1) {
LAB_001d66fa:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_58);
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
    ::~raw_hash_set(&local_78);
    (*local_88)(dispose,&local_98,&local_98);
    std::
    vector<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
    ::~vector(&local_b8);
    std::
    vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
    ::~vector(&local_d0);
    if (local_e8 != (pointer)0x0) {
      operator_delete(local_e8,(long)local_d8 - (long)local_e8);
    }
    bVar4 = true;
    if (local_158[0]._M_allocated_capacity != 0) {
      (**(code **)(*(long *)CONCAT53(uStack_165,CONCAT12(bStack_166,local_168)) + 0x18))();
    }
    io::FileOutputStream::~FileOutputStream((FileOutputStream *)local_208);
    goto LAB_001d6885;
  }
  iVar5 = 0;
  pbVar1 = (pointer)(local_288 + 0x10);
  while( true ) {
    pVVar8 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>>
                       ((RepeatedPtrFieldBase *)(local_1b0 + 0x28),iVar5);
    puVar12 = (undefined8 *)
              ((ulong)(pVVar8->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    local_288._8_8_ = (pointer)0x0;
    local_288._16_8_ = local_288._16_8_ & 0xffffffffffffff00;
    local_288._0_8_ = pbVar1;
    if (local_240 == (DiskSourceTree *)0x0) break;
    virtual_file._M_str = (char *)*puVar12;
    virtual_file._M_len = puVar12[1];
    bVar4 = DiskSourceTree::VirtualFileToDiskFile(local_240,virtual_file,(string *)local_288);
    if (!bVar4) break;
    text_01._M_str = " $disk_file$";
    text_01._M_len = 0xc;
    io::Printer::Print<char[10],std::__cxx11::string>
              ((Printer *)local_168,text_01,(char (*) [10])"disk_file",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288);
    if (iVar5 < local_1b0._48_4_ + -1) {
      text_02._M_str = "\\\n";
      text_02._M_len = 2;
      io::Printer::Print<>((Printer *)local_168,text_02);
    }
    if ((pointer)local_288._0_8_ != pbVar1) {
      operator_delete((void *)local_288._0_8_,(ulong)(local_288._16_8_ + 1));
    }
    iVar5 = iVar5 + 1;
    if ((int)local_1b0._48_4_ <= iVar5) goto LAB_001d66fa;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Unable to identify path for file ",0x21);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(char *)*puVar12,puVar12[1]);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  if ((pointer)local_288._0_8_ != pbVar1) {
    operator_delete((void *)local_288._0_8_,(ulong)(local_288._16_8_ + 1));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  ::~raw_hash_set(&local_78);
  (*local_88)(dispose,&local_98,&local_98);
  std::
  vector<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
  ::~vector(&local_b8);
  std::
  vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
  ::~vector(&local_d0);
  if (local_e8 != (pointer)0x0) {
    operator_delete(local_e8,(long)local_d8 - (long)local_e8);
  }
  if (local_158[0]._M_allocated_capacity != 0) {
    (**(code **)(*(long *)CONCAT53(uStack_165,CONCAT12(bStack_166,local_168)) + 0x18))();
  }
  io::FileOutputStream::~FileOutputStream((FileOutputStream *)local_208);
  goto LAB_001d6883;
code_r0x001d6536:
  piVar7 = __errno_location();
  if (*piVar7 != 4) {
    perror((pCVar3->dependency_out_name_)._M_dataplus._M_p);
LAB_001d6883:
    bVar4 = false;
LAB_001d6885:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_268);
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::destructor_impl(&local_228);
    FileDescriptorSet::~FileDescriptorSet((FileDescriptorSet *)local_1b0);
    return bVar4;
  }
  goto LAB_001d651a;
}

Assistant:

bool CommandLineInterface::GenerateDependencyManifestFile(
    const std::vector<const FileDescriptor*>& parsed_files,
    const GeneratorContextMap& output_directories,
    DiskSourceTree* source_tree) {
  FileDescriptorSet file_set;

  absl::flat_hash_set<const FileDescriptor*> already_seen;
  for (size_t i = 0; i < parsed_files.size(); ++i) {
    GetTransitiveDependencies(parsed_files[i], &already_seen,
                              file_set.mutable_file());
  }

  std::vector<std::string> output_filenames;
  for (const auto& pair : output_directories) {
    const std::string& location = pair.first;
    GeneratorContextImpl* directory = pair.second.get();
    std::vector<std::string> relative_output_filenames;
    directory->GetOutputFilenames(&relative_output_filenames);
    for (size_t i = 0; i < relative_output_filenames.size(); ++i) {
      std::string output_filename = location + relative_output_filenames[i];
      if (output_filename.compare(0, 2, "./") == 0) {
        output_filename = output_filename.substr(2);
      }
      output_filenames.push_back(output_filename);
    }
  }

  if (!descriptor_set_out_name_.empty()) {
    output_filenames.push_back(descriptor_set_out_name_);
  }

  if (!edition_defaults_out_name_.empty()) {
    output_filenames.push_back(edition_defaults_out_name_);
  }

  // Create the depfile, even if it will be empty.
  int fd;
  do {
    fd = open(dependency_out_name_.c_str(),
              O_WRONLY | O_CREAT | O_TRUNC | O_BINARY, 0666);
  } while (fd < 0 && errno == EINTR);

  if (fd < 0) {
    perror(dependency_out_name_.c_str());
    return false;
  }

  // Only write to the depfile if there is at least one output_filename.
  // Otherwise, the depfile will be malformed.
  if (!output_filenames.empty()) {
    io::FileOutputStream out(fd);
    io::Printer printer(&out, '$');

    for (size_t i = 0; i < output_filenames.size(); ++i) {
      printer.Print(output_filenames[i]);
      if (i == output_filenames.size() - 1) {
        printer.Print(":");
      } else {
        printer.Print(" \\\n");
      }
    }

    for (int i = 0; i < file_set.file_size(); ++i) {
      const FileDescriptorProto& file = file_set.file(i);
      const std::string& virtual_file = file.name();
      std::string disk_file;
      if (source_tree &&
          source_tree->VirtualFileToDiskFile(virtual_file, &disk_file)) {
        printer.Print(" $disk_file$", "disk_file", disk_file);
        if (i < file_set.file_size() - 1) printer.Print("\\\n");
      } else {
        std::cerr << "Unable to identify path for file " << virtual_file
                  << std::endl;
        return false;
      }
    }
  }

  return true;
}